

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_transporter.cpp
# Opt level: O0

int __thiscall SocketServerTransporter::Stop(SocketServerTransporter *this)

{
  SocketServerTransporter *this_local;
  
  uv_close((uv_handle_t *)&this->uvServer,(uv_close_cb)0x0);
  if (this->uvClient != (uv_stream_t *)0x0) {
    uv_read_stop(this->uvClient);
    uv_close((uv_handle_t *)this->uvClient,(uv_close_cb)0x0);
  }
  Transporter::Stop(&this->super_Transporter);
  return 0;
}

Assistant:

int SocketServerTransporter::Stop() {
	uv_close((uv_handle_t*)&uvServer, nullptr);
	if (uvClient) {
		uv_read_stop(uvClient);
		uv_close((uv_handle_t*)uvClient, nullptr);
	}
	Transporter::Stop();
	return 0;
}